

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

QList<QRect> * QMdi::MinOverlapPlacer::findNonInsiders(QRect *domain,QList<QRect> *source)

{
  anon_class_16_1_5217c602 __pred;
  iterator aend;
  iterator __first;
  iterator iVar1;
  back_insert_iterator<QList<QRect>_> __last;
  const_iterator in_RDX;
  undefined8 *in_RSI;
  QList<QRect> *in_RDI;
  long in_FS_OFFSET;
  QList<QRect> *result;
  iterator firstOut;
  anon_class_16_1_5217c602 containedInDomain;
  QList<QRect> *this;
  back_insert_iterator<QList<QRect>_> in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  QList<QRect> *asize;
  const_iterator local_60;
  QRect *local_58;
  const_iterator local_50;
  QRect *local_48;
  QRect *local_40;
  iterator local_38;
  undefined8 local_30;
  undefined8 local_28;
  iterator local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = *in_RSI;
  local_10 = in_RSI[1];
  local_20.i = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  asize = in_RDI;
  aend = QList<QRect>::begin(in_RDI);
  __first = QList<QRect>::end(this);
  local_30 = local_18;
  local_28 = local_10;
  iVar1.i._7_1_ = in_stack_ffffffffffffff77;
  iVar1.i._0_7_ = in_stack_ffffffffffffff70;
  __pred.domain.x2.m_i = (int)in_stack_ffffffffffffff68;
  __pred.domain.y2.m_i = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  __pred.domain.x1.m_i = (int)in_stack_ffffffffffffff60;
  __pred.domain.y1.m_i = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_20 = std::
             stable_partition<QList<QRect>::iterator,QMdi::MinOverlapPlacer::findNonInsiders(QRect_const&,QList<QRect>&)::__0>
                       (__first,iVar1,__pred);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QRect>::QList((QList<QRect> *)0x60d355);
  local_38 = QList<QRect>::end(this);
  local_40 = local_20.i;
  QList<QRect>::iterator::operator-(&local_38,local_20);
  QList<QRect>::reserve(in_stack_ffffffffffffff58.container,(qsizetype)asize);
  local_48 = local_20.i;
  iVar1 = QList<QRect>::end(this);
  __last = std::back_inserter<QList<QRect>>(this);
  std::copy<QList<QRect>::iterator,std::back_insert_iterator<QList<QRect>>>
            (iVar1,(iterator)__last.container,in_stack_ffffffffffffff58);
  local_58 = local_20.i;
  QList<QRect>::const_iterator::const_iterator(&local_50,local_20);
  iVar1 = QList<QRect>::end(this);
  QList<QRect>::const_iterator::const_iterator(&local_60,iVar1);
  QList<QRect>::erase((QList<QRect> *)iVar1.i,in_RDX,(const_iterator)aend.i);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QList<QRect> MinOverlapPlacer::findNonInsiders(const QRect &domain, QList<QRect> &source)
{
    const auto containedInDomain =
            [domain](const QRect &srcRect) { return domain.contains(srcRect); };

    const auto firstOut = std::stable_partition(source.begin(), source.end(), containedInDomain);

    QList<QRect> result;
    result.reserve(source.end() - firstOut);
    std::copy(firstOut, source.end(), std::back_inserter(result));

    source.erase(firstOut, source.end());

    return result;
}